

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O2

void __thiscall skiplist_tests::skiplist_test::test_method(skiplist_test *this)

{
  long lVar1;
  pointer pCVar2;
  int height;
  int height_00;
  CBlockIndex *pCVar3;
  int i;
  int iVar4;
  long lVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  RandomMixin<FastRandomContext> *this_00;
  RandomMixin<FastRandomContext> *pRVar10;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  lazy_ostream local_a8;
  undefined1 *local_98;
  char **local_90;
  assertion_result local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  vector<CBlockIndex,_std::allocator<CBlockIndex>_> vIndex;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::vector
            (&vIndex,300000,(allocator_type *)&local_a8);
  iVar4 = 0;
  for (lVar8 = 0; lVar8 != 45600000; lVar8 = lVar8 + 0x98) {
    lVar5 = (long)vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                  super__Vector_impl_data._M_start[-1].nChainWork.super_base_uint<256U>.pn +
            lVar8 + -0x28;
    *(int *)((long)((vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                     super__Vector_impl_data._M_start)->nChainWork).super_base_uint<256U>.pn +
            lVar8 + -0x10) = iVar4;
    if (lVar8 == 0) {
      lVar5 = 0;
    }
    *(long *)((long)(&(vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                       super__Vector_impl_data._M_start)->nChainWork + -1) + lVar8) = lVar5;
    CBlockIndex::BuildSkip
              ((CBlockIndex *)
               ((long)((vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl
                        .super__Vector_impl_data._M_start)->nChainWork).super_base_uint<256U>.pn +
               lVar8 + -0x28));
    iVar4 = iVar4 + 1;
  }
  lVar8 = 0x10;
  lVar5 = 0;
  do {
    if (lVar5 == 0) {
      local_108 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_100 = "";
      local_118 = &boost::unit_test::basic_cstring<char_const>::null;
      local_110 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x20;
      file_01.m_begin = (iterator)&local_108;
      msg_01.m_end = in_R9;
      msg_01.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_118,
                 msg_01);
      local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           ((vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
             super__Vector_impl_data._M_start)->pskip == (CBlockIndex *)0x0);
      local_88.m_message.px = (element_type *)0x0;
      local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b8 = "vIndex[i].pskip == nullptr";
      local_b0 = "";
      local_a8.m_empty = false;
      local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
      local_98 = boost::unit_test::lazy_ostream::inst;
      local_90 = &local_b8;
      local_128 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_120 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_88,&local_a8,1,0,WARN,(check_type)this,(size_t)&local_128,0x20);
    }
    else {
      if (lVar5 == 300000) {
        iVar4 = 1000;
        this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                   super_RandomMixin<FastRandomContext>;
        while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
          pRVar10 = this_00;
          height = RandomMixin<FastRandomContext>::randrange<int>(this_00,299999);
          height_00 = RandomMixin<FastRandomContext>::randrange<int>(this_00,height + 1);
          local_138 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
          ;
          local_130 = "";
          local_148 = &boost::unit_test::basic_cstring<char_const>::null;
          local_140 = &boost::unit_test::basic_cstring<char_const>::null;
          file_02.m_end = &DAT_00000028;
          file_02.m_begin = (iterator)&local_138;
          msg_02.m_end = in_R9;
          msg_02.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                     (size_t)&local_148,msg_02);
          pCVar3 = CBlockIndex::GetAncestor
                             (vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                              _M_impl.super__Vector_impl_data._M_start + 299999,height);
          local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (pCVar3 ==
                 vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                 super__Vector_impl_data._M_start + height);
          local_88.m_message.px = (element_type *)0x0;
          local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b8 = "vIndex[300000 - 1].GetAncestor(from) == &vIndex[from]";
          local_b0 = "";
          local_a8.m_empty = false;
          local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
          local_98 = boost::unit_test::lazy_ostream::inst;
          local_90 = &local_b8;
          local_158 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
          ;
          local_150 = "";
          pvVar6 = &DAT_00000001;
          pvVar7 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_88,&local_a8,1,0,WARN,(check_type)pRVar10,(size_t)&local_158,0x28);
          boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
          local_168 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
          ;
          local_160 = "";
          local_178 = &boost::unit_test::basic_cstring<char_const>::null;
          local_170 = &boost::unit_test::basic_cstring<char_const>::null;
          file_03.m_end = (iterator)0x29;
          file_03.m_begin = (iterator)&local_168;
          msg_03.m_end = pvVar7;
          msg_03.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_178,msg_03);
          pCVar3 = CBlockIndex::GetAncestor
                             (vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                              _M_impl.super__Vector_impl_data._M_start + height,height_00);
          local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (pCVar3 ==
                 vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                 super__Vector_impl_data._M_start + height_00);
          local_88.m_message.px = (element_type *)0x0;
          local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b8 = "vIndex[from].GetAncestor(to) == &vIndex[to]";
          local_b0 = "";
          local_a8.m_empty = false;
          local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
          local_98 = boost::unit_test::lazy_ostream::inst;
          local_90 = &local_b8;
          local_188 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
          ;
          local_180 = "";
          pvVar6 = &DAT_00000001;
          pvVar7 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_88,&local_a8,1,0,WARN,(check_type)pRVar10,(size_t)&local_188,0x29);
          boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
          local_198 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
          ;
          local_190 = "";
          local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_04.m_end = (iterator)0x2a;
          file_04.m_begin = (iterator)&local_198;
          msg_04.m_end = pvVar7;
          msg_04.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                     (size_t)&local_1a8,msg_04);
          pCVar3 = CBlockIndex::GetAncestor
                             (vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                              _M_impl.super__Vector_impl_data._M_start + height,0);
          local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (pCVar3 ==
                 vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                 super__Vector_impl_data._M_start);
          local_88.m_message.px = (element_type *)0x0;
          local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b8 = "vIndex[from].GetAncestor(0) == vIndex.data()";
          local_b0 = "";
          local_a8.m_empty = false;
          local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
          local_98 = boost::unit_test::lazy_ostream::inst;
          local_90 = &local_b8;
          local_1b8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
          ;
          local_1b0 = "";
          in_R8 = &DAT_00000001;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_88,&local_a8,1,0,WARN,(check_type)pRVar10,(size_t)&local_1b8,0x2a);
          boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
          this_00 = pRVar10;
        }
        std::_Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>::~_Vector_base
                  (&vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
        __stack_chk_fail();
      }
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_58 = "";
      local_70 = &boost::unit_test::basic_cstring<char_const>::null;
      local_68 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x1d;
      file.m_begin = (iterator)&local_60;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,msg);
      pCVar2 = *(pointer *)
                ((long)((vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                         _M_impl.super__Vector_impl_data._M_start)->nChainWork).
                       super_base_uint<256U>.pn + lVar8 + -0x28);
      local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (pCVar2 ==
           vIndex.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
           super__Vector_impl_data._M_start + pCVar2->nHeight);
      local_88.m_message.px = (element_type *)0x0;
      local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b8 = "vIndex[i].pskip == &vIndex[vIndex[i].pskip->nHeight]";
      local_b0 = "";
      local_a8.m_empty = false;
      local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
      local_98 = boost::unit_test::lazy_ostream::inst;
      local_90 = &local_b8;
      local_c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_c0 = "";
      pvVar6 = &DAT_00000001;
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_88,&local_a8,1,0,WARN,(check_type)this,(size_t)&local_c8,0x1d);
      boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
      local_d8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_d0 = "";
      local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x1e;
      file_00.m_begin = (iterator)&local_d8;
      msg_00.m_end = pvVar7;
      msg_00.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e8,
                 msg_00);
      local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (*(int *)(*(long *)((long)((vIndex.
                                       super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->nChainWork).
                                     super_base_uint<256U>.pn + lVar8 + -0x28) + 0x18) < lVar5);
      local_88.m_message.px = (element_type *)0x0;
      local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b8 = "vIndex[i].pskip->nHeight < i";
      local_b0 = "";
      local_a8.m_empty = false;
      local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
      local_98 = boost::unit_test::lazy_ostream::inst;
      local_90 = &local_b8;
      local_f8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_f0 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_88,&local_a8,1,0,WARN,(check_type)this,(size_t)&local_f8,0x1e);
    }
    boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
    lVar5 = lVar5 + 1;
    lVar8 = lVar8 + 0x98;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(skiplist_test)
{
    std::vector<CBlockIndex> vIndex(SKIPLIST_LENGTH);

    for (int i=0; i<SKIPLIST_LENGTH; i++) {
        vIndex[i].nHeight = i;
        vIndex[i].pprev = (i == 0) ? nullptr : &vIndex[i - 1];
        vIndex[i].BuildSkip();
    }

    for (int i=0; i<SKIPLIST_LENGTH; i++) {
        if (i > 0) {
            BOOST_CHECK(vIndex[i].pskip == &vIndex[vIndex[i].pskip->nHeight]);
            BOOST_CHECK(vIndex[i].pskip->nHeight < i);
        } else {
            BOOST_CHECK(vIndex[i].pskip == nullptr);
        }
    }

    for (int i=0; i < 1000; i++) {
        int from = m_rng.randrange(SKIPLIST_LENGTH - 1);
        int to = m_rng.randrange(from + 1);

        BOOST_CHECK(vIndex[SKIPLIST_LENGTH - 1].GetAncestor(from) == &vIndex[from]);
        BOOST_CHECK(vIndex[from].GetAncestor(to) == &vIndex[to]);
        BOOST_CHECK(vIndex[from].GetAncestor(0) == vIndex.data());
    }
}